

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

bool __thiscall efsw::FileInfo::exists(FileInfo *this)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [4];
  int res;
  stat st;
  bool slashAtEnd;
  FileInfo *this_local;
  
  st.__glibc_reserved[2]._7_1_ = FileSystem::slashAtEnd(&this->Filepath);
  if ((bool)st.__glibc_reserved[2]._7_1_) {
    FileSystem::dirRemoveSlashAtEnd(&this->Filepath);
  }
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a8);
  if ((st.__glibc_reserved[2]._7_1_ & 1) != 0) {
    FileSystem::dirAddSlashAtEnd(&this->Filepath);
  }
  return iVar1 == 0;
}

Assistant:

bool FileInfo::exists() {
	bool slashAtEnd = FileSystem::slashAtEnd( Filepath );

	if ( slashAtEnd ) {
		FileSystem::dirRemoveSlashAtEnd( Filepath );
	}

#if EFSW_PLATFORM != EFSW_PLATFORM_WIN32
	struct stat st;
	int res = stat( Filepath.c_str(), &st );
#else
	struct _stat st;
	int res = _wstat( String::fromUtf8( Filepath ).toWideString().c_str(), &st );
#endif

	if ( slashAtEnd ) {
		FileSystem::dirAddSlashAtEnd( Filepath );
	}

	return 0 == res;
}